

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakSet.cpp
# Opt level: O1

Var Js::JavascriptWeakSet::EntryDelete(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  EventLog *this;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptWeakSet *pJVar7;
  RecyclableObject *instance;
  RecyclableObject *this_00;
  JavascriptBoolean *pJVar8;
  Type TVar9;
  int in_stack_00000010;
  RecyclableObject *local_70;
  undefined1 local_68 [8];
  ArgumentReader args;
  CallInfo local_40;
  CallInfo callInfo_local;
  bool unused;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_40 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_40._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptWeakSet.cpp"
                                ,0x76,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d393d9;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_68 = (undefined1  [8])local_40;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_68,&local_40);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pvVar6 = Arguments::operator[]((Arguments *)local_68,0);
  bVar3 = VarIs<Js::JavascriptWeakSet>(pvVar6);
  if (!bVar3) {
    JavascriptError::ThrowTypeErrorVar(pSVar1,-0x7ff5ec04,L"WeakSet.prototype.delete",L"WeakSet");
  }
  pvVar6 = Arguments::operator[]((Arguments *)local_68,0);
  pJVar7 = VarTo<Js::JavascriptWeakSet>(pvVar6);
  if (((ulong)local_68 & 0xfffffe) == 0) {
    instance = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               undefinedValue.ptr;
  }
  else {
    instance = (RecyclableObject *)Arguments::operator[]((Arguments *)local_68,1);
  }
  BVar4 = JavascriptOperators::IsObject(instance);
  if (BVar4 != 0) {
    if (instance == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00d393d9;
      *puVar5 = 0;
    }
    args.super_Arguments.Values = (Type)function;
    if (((ulong)instance & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)instance & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00d393d9;
      *puVar5 = 0;
    }
    function = (RecyclableObject *)args.super_Arguments.Values;
    TVar9 = TypeIds_FirstNumberType;
    if ((((ulong)instance & 0xffff000000000000) != 0x1000000000000) &&
       (TVar9 = TypeIds_Number, (ulong)instance >> 0x32 == 0)) {
      this_00 = UnsafeVarTo<Js::RecyclableObject>(instance);
      if (this_00 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00d393d9;
        *puVar5 = 0;
      }
      TVar9 = ((this_00->type).ptr)->typeId;
      if (0x57 < (int)TVar9) {
        BVar4 = RecyclableObject::IsExternal(this_00);
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar3) {
LAB_00d393d9:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
      }
    }
    if (TVar9 != TypeIds_HostDispatch) {
      local_70 = VarTo<Js::RecyclableObject>(instance);
      callInfo_local._7_1_ = 0;
      bVar3 = JsUtil::
              SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
              ::TryGetValueAndRemove
                        (&(pJVar7->keySet).
                          super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                         ,&local_70,(TBValue *)&callInfo_local.field_0x7);
      goto LAB_00d39379;
    }
  }
  bVar3 = false;
LAB_00d39379:
  if (pSVar1->TTDRecordOrReplayModeEnabled == true) {
    this = ((((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr)->threadContext->TTDLog;
    if (pSVar1->TTDRecordModeEnabled == true) {
      TTD::EventLog::RecordWeakCollectionContainsEvent(this,bVar3);
    }
    else {
      bVar3 = TTD::EventLog::ReplayWeakCollectionContainsEvent(this);
    }
  }
  pJVar8 = JavascriptLibrary::CreateBoolean
                     ((pSVar1->super_ScriptContextBase).javascriptLibrary,(uint)bVar3);
  return pJVar8;
}

Assistant:

Var JavascriptWeakSet::EntryDelete(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        if (!VarIs<JavascriptWeakSet>(args[0]))
        {
            JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("WeakSet.prototype.delete"), _u("WeakSet"));
        }

        JavascriptWeakSet* weakSet = VarTo<JavascriptWeakSet>(args[0]);

        Var key = (args.Info.Count > 1) ? args[1] : scriptContext->GetLibrary()->GetUndefined();
        bool didDelete = false;

        if (JavascriptOperators::IsObject(key) && JavascriptOperators::GetTypeId(key) != TypeIds_HostDispatch)
        {
            RecyclableObject* keyObj = VarTo<RecyclableObject>(key);

            didDelete = weakSet->Delete(keyObj);
        }

#if ENABLE_TTD
        if(scriptContext->IsTTDRecordOrReplayModeEnabled())
        {
            if(scriptContext->IsTTDRecordModeEnabled())
            {
                function->GetScriptContext()->GetThreadContext()->TTDLog->RecordWeakCollectionContainsEvent(didDelete);
            }
            else
            {
                didDelete = function->GetScriptContext()->GetThreadContext()->TTDLog->ReplayWeakCollectionContainsEvent();
            }
        }
#endif

        return scriptContext->GetLibrary()->CreateBoolean(didDelete);
    }